

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,bool skipInitialParam,
          SymbolListCItr currSym,SymbolListCItr endSym)

{
  pointer *__r;
  bool bVar1;
  VisibilityType VVar2;
  pointer pSVar3;
  element_type *peVar4;
  reference name;
  char *pcVar5;
  bool local_221;
  shared_ptr<Jinx::Impl::Library> local_210;
  undefined1 local_200 [8];
  FunctionMatch newMatch;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *libName;
  const_iterator __end6;
  const_iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range6;
  shared_ptr<Jinx::Impl::Library> local_1a0;
  FunctionMatch local_190;
  undefined1 local_170 [8];
  LibraryIPtr library_1;
  FunctionMatch local_140;
  Symbol *local_120;
  Symbol *local_118;
  FunctionMatch local_110;
  Symbol *local_f0;
  Symbol *local_e8;
  shared_ptr<Jinx::Impl::Library> local_e0;
  FunctionMatch local_d0;
  undefined1 local_b0 [8];
  LibraryIPtr library;
  String libraryName;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_60;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_58;
  SymbolListCItr currentSymbol;
  FunctionMatch match;
  bool skipInitialParam_local;
  Parser *this_local;
  SymbolListCItr endSym_local;
  SymbolListCItr currSym_local;
  
  FunctionMatch::FunctionMatch((FunctionMatch *)&currentSymbol);
  local_221 = true;
  local_58._M_current = currSym._M_current;
  if ((this->m_error & 1U) == 0) {
    local_60._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    local_221 = __gnu_cxx::operator==(&local_58,&local_60);
  }
  if (local_221 != false) {
    FunctionMatch::FunctionMatch(__return_storage_ptr__,(FunctionMatch *)&currentSymbol);
    goto LAB_002173ff;
  }
  pSVar3 = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
           ::operator->(&local_58);
  bVar1 = IsOperator(pSVar3->type);
  if ((bVar1) &&
     (pSVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&local_58), pSVar3->type != ParenOpen)) {
    FunctionMatch::FunctionMatch(__return_storage_ptr__,(FunctionMatch *)&currentSymbol);
    goto LAB_002173ff;
  }
  CheckLibraryName_abi_cxx11_((String *)&stack0xffffffffffffff68,this);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     &stack0xffffffffffffff68);
  if (bVar1) {
LAB_00216da4:
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       &stack0xffffffffffffff68);
    if (bVar1) {
      local_118 = local_58._M_current;
      local_120 = endSym._M_current;
      CheckFunctionCall(&local_110,this,&this->m_localFunctions,(SymbolListCItr)local_58._M_current,
                        endSym,skipInitialParam);
      FunctionMatch::operator=((FunctionMatch *)&currentSymbol,&local_110);
      FunctionMatch::~FunctionMatch(&local_110);
      if (currentSymbol._M_current == (Symbol *)0x0) {
        std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                  ((shared_ptr<Jinx::Impl::Library> *)&stack0xfffffffffffffeb0,&this->m_library);
        library_1.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)endSym._M_current;
        CheckFunctionCall(&local_140,this,
                          (shared_ptr<Jinx::Impl::Library> *)&stack0xfffffffffffffeb0,
                          (SymbolListCItr)local_58._M_current,endSym,skipInitialParam);
        FunctionMatch::operator=((FunctionMatch *)&currentSymbol,&local_140);
        FunctionMatch::~FunctionMatch(&local_140);
        std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                  ((shared_ptr<Jinx::Impl::Library> *)&stack0xfffffffffffffeb0);
        if (currentSymbol._M_current == (Symbol *)0x0) {
          peVar4 = std::
                   __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m_runtime);
          Runtime::GetLibraryInternal((Runtime *)local_170,(String *)peVar4);
          std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                    (&local_1a0,(shared_ptr<Jinx::Impl::Library> *)local_170);
          CheckFunctionCall(&local_190,this,&local_1a0,(SymbolListCItr)local_58._M_current,endSym,
                            skipInitialParam);
          FunctionMatch::operator=((FunctionMatch *)&currentSymbol,&local_190);
          FunctionMatch::~FunctionMatch(&local_190);
          std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&local_1a0);
          if (currentSymbol._M_current == (Symbol *)0x0) {
            __end6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                     ::begin(&this->m_importList);
            libName = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                      ::end(&this->m_importList);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                                               *)&libName), bVar1) {
              name = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                     ::operator*(&__end6);
              peVar4 = std::
                       __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->m_runtime);
              bVar1 = Runtime::LibraryExists(peVar4,name);
              if (!bVar1) {
                pcVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                                   (name);
                LogWriteLine(Warning,"Unable to find library \'%s\'",pcVar5);
                FunctionMatch::FunctionMatch(__return_storage_ptr__);
                bVar1 = true;
                goto LAB_002173a3;
              }
              peVar4 = std::
                       __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->m_runtime);
              Runtime::GetLibraryInternal
                        ((Runtime *)
                         &newMatch.partData.
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(String *)peVar4);
              __r = &newMatch.partData.
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::shared_ptr<Jinx::Impl::Library>::operator=
                        ((shared_ptr<Jinx::Impl::Library> *)local_170,
                         (shared_ptr<Jinx::Impl::Library> *)__r);
              std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                        ((shared_ptr<Jinx::Impl::Library> *)__r);
              std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                        (&local_210,(shared_ptr<Jinx::Impl::Library> *)local_170);
              CheckFunctionCall((FunctionMatch *)local_200,this,&local_210,
                                (SymbolListCItr)local_58._M_current,endSym,skipInitialParam);
              std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&local_210);
              if (local_200 == (undefined1  [8])0x0) {
LAB_0021736b:
                bVar1 = false;
              }
              else if (currentSymbol._M_current == (Symbol *)0x0) {
                FunctionMatch::operator=((FunctionMatch *)&currentSymbol,(FunctionMatch *)local_200)
                ;
                VVar2 = FunctionSignature::GetVisibility
                                  ((FunctionSignature *)currentSymbol._M_current);
                if ((VVar2 != Private) ||
                   (bVar1 = std::operator!=((shared_ptr<Jinx::Impl::Library> *)local_170,
                                            &this->m_library), !bVar1)) goto LAB_0021736b;
                LogWriteLine(Error,"Unable to call library function with private scope.");
                FunctionMatch::FunctionMatch(__return_storage_ptr__);
                bVar1 = true;
              }
              else {
                LogWriteLine(Warning,
                             "Ambiguous function name detected.  Use library name to disambiguate.")
                ;
                FunctionMatch::FunctionMatch(__return_storage_ptr__);
                bVar1 = true;
              }
              FunctionMatch::~FunctionMatch((FunctionMatch *)local_200);
              if (bVar1) goto LAB_002173a3;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
              ::operator++(&__end6);
            }
          }
          bVar1 = false;
LAB_002173a3:
          std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                    ((shared_ptr<Jinx::Impl::Library> *)local_170);
          if (bVar1) goto LAB_002173e3;
        }
      }
    }
    else {
      peVar4 = std::
               __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_runtime);
      Runtime::GetLibraryInternal((Runtime *)local_b0,(String *)peVar4);
      std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                (&local_e0,(shared_ptr<Jinx::Impl::Library> *)local_b0);
      local_e8 = local_58._M_current;
      local_f0 = endSym._M_current;
      CheckFunctionCall(&local_d0,this,&local_e0,(SymbolListCItr)local_58._M_current,endSym,
                        skipInitialParam);
      FunctionMatch::operator=((FunctionMatch *)&currentSymbol,&local_d0);
      FunctionMatch::~FunctionMatch(&local_d0);
      std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&local_e0);
      std::shared_ptr<Jinx::Impl::Library>::~shared_ptr((shared_ptr<Jinx::Impl::Library> *)local_b0)
      ;
    }
    FunctionMatch::FunctionMatch(__return_storage_ptr__,(FunctionMatch *)&currentSymbol);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_58);
    library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    bVar1 = __gnu_cxx::operator==
                      (&local_58,
                       (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)&library.
                           super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) goto LAB_00216da4;
    FunctionMatch::FunctionMatch(__return_storage_ptr__,(FunctionMatch *)&currentSymbol);
  }
LAB_002173e3:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
             &stack0xffffffffffffff68);
LAB_002173ff:
  FunctionMatch::~FunctionMatch((FunctionMatch *)&currentSymbol);
  return __return_storage_ptr__;
}

Assistant:

inline Parser::FunctionMatch Parser::CheckFunctionCall(bool skipInitialParam, SymbolListCItr currSym, SymbolListCItr endSym) const
	{
		FunctionMatch match;

		// Store current symbol
		auto currentSymbol = currSym;

		// Check for error or invalid symbols
		if (m_error || currentSymbol == m_symbolList.end())
			return match;

		// Any operators other than open parentheses mean this can't be a function call
		if (IsOperator(currentSymbol->type) && (currentSymbol->type != SymbolType::ParenOpen))
			return match;

		// Check for explicit library name in the first symbol.  libraryName is empty if not found.
		String libraryName = CheckLibraryName();

		// Advance the current symbol if we found a valid library name
		if (!libraryName.empty())
		{
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return match;
		}

		// If we explicitly specify a library name, then only look in that library
		if (!libraryName.empty())
		{
			auto library = m_runtime->GetLibraryInternal(libraryName);
			match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
		}
		else
		{
			// Check local function table for signature match
			match = CheckFunctionCall(m_localFunctions, currentSymbol, endSym, skipInitialParam);

			// If not found in local function table, search in libraries for a function match
			if (!match.signature)
			{
				// Check the current library for a signature match
				match = CheckFunctionCall(m_library, currentSymbol, endSym, skipInitialParam);

				// If a library name isn't specified or a signature wasn't found, search first in current library, then in order of imports
				if (!match.signature)
				{
					// Search default library first
					auto library = m_runtime->GetLibraryInternal(libraryName);
					match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);

					// If function wasn't found in default library, search through all import libraries
					if (!match.signature)
					{
						// Loop through all imported library names
						for (const auto & libName : m_importList)
						{
							// Make sure the library exists
							if (!m_runtime->LibraryExists(libName))
							{
								LogWriteLine(LogLevel::Warning, "Unable to find library '%s'", libName.c_str());
								return FunctionMatch();
							}

							// Search for function in this library
							library = m_runtime->GetLibraryInternal(libName);
							auto newMatch = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
							if (newMatch.signature)
							{
								if (match.signature)
								{
									LogWriteLine(LogLevel::Warning, "Ambiguous function name detected.  Use library name to disambiguate.");
									return FunctionMatch();
								}
								else
								{
									match = newMatch;
									if (match.signature->GetVisibility() == VisibilityType::Private && library != m_library)
									{
										LogWriteLine(LogLevel::Error, "Unable to call library function with private scope.");
										return FunctionMatch();
									}
								}
							}
						}
					}
				}
			}
		}

		return match;
	}